

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::calc_node_distance(Graph *this)

{
  long in_RDI;
  double dVar1;
  double dVar2;
  int j;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_10 = local_c, local_c < *(int *)(in_RDI + 0xc); local_c = local_c + 1) {
    while (local_10 = local_10 + 1, local_10 < *(int *)(in_RDI + 0xc)) {
      dVar1 = pow((double)(*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20) -
                          *(int *)(*(long *)(in_RDI + 0x18) + (long)local_10 * 0x20)),2.0);
      dVar2 = pow((double)(*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 4) -
                          *(int *)(*(long *)(in_RDI + 0x18) + (long)local_10 * 0x20 + 4)),2.0);
      dVar1 = sqrt(dVar1 + dVar2);
      *(double *)(*(long *)(*(long *)(in_RDI + 0x20) + (long)local_10 * 8) + (long)local_c * 8) =
           dVar1;
      *(double *)(*(long *)(*(long *)(in_RDI + 0x20) + (long)local_c * 8) + (long)local_10 * 8) =
           dVar1;
    }
  }
  return;
}

Assistant:

void Graph::calc_node_distance()
{
	for(int i = 0; i < num_node; i++){
		for(int j = i + 1; j < num_node; j++){
			distance_matrix[i][j] = distance_matrix[j][i] = sqrt(pow(nodes[i].x - nodes[j].x, 2) + pow(nodes[i].y - nodes[j].y, 2));
		}
	}
}